

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::eliminateColSingletons
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  uint *puVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  Pring *pPVar9;
  int *piVar10;
  Pring *pPVar11;
  pointer pnVar12;
  int *piVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  int32_t iVar21;
  Pring *pPVar22;
  Pring *pPVar23;
  Pring *pPVar24;
  int iVar25;
  int iVar26;
  int *piVar27;
  long lVar28;
  int *piVar29;
  long lVar30;
  int iVar31;
  int *piVar32;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  pPVar22 = (this->temp).pivot_colNZ;
  pPVar23 = pPVar22[1].prev;
  pPVar24 = pPVar22 + 1;
  if (pPVar23 != pPVar24) {
    piVar32 = (this->u).row.start;
    do {
      iVar3 = pPVar23->idx;
      piVar6 = (this->u).col.len;
      iVar4 = piVar6[iVar3];
      piVar6[iVar3] = iVar4 + -1;
      piVar7 = (this->u).col.idx;
      piVar8 = (this->u).col.start;
      iVar4 = piVar7[(long)piVar8[iVar3] + -1 + (long)iVar4];
      pPVar24 = (this->temp).pivot_row;
      pPVar9 = pPVar24[iVar4].next;
      pPVar24 = pPVar24[iVar4].prev;
      pPVar9->prev = pPVar24;
      pPVar24->next = pPVar9;
      piVar10 = (this->u).row.len;
      iVar26 = piVar10[iVar4];
      piVar10[iVar4] = iVar26 + -1;
      lVar30 = (long)piVar32[iVar4] + -1 + (long)iVar26;
      piVar32 = (this->u).row.idx;
      iVar26 = piVar32[lVar30];
      iVar25 = (int)lVar30;
      lVar28 = lVar30;
      if (iVar26 != iVar3) {
        piVar10 = (this->temp).s_cact;
        pPVar24 = (this->temp).pivot_col;
        do {
          iVar25 = piVar8[iVar26];
          iVar5 = piVar6[iVar26];
          iVar31 = piVar10[iVar26];
          piVar10[iVar26] = iVar31 + -1;
          iVar31 = (iVar25 + iVar5) - iVar31;
          piVar13 = piVar7 + iVar31;
          do {
            piVar27 = piVar13;
            piVar13 = piVar27 + 1;
          } while (*piVar27 != iVar4);
          *piVar27 = piVar7[iVar31];
          piVar7[iVar31] = iVar4;
          iVar25 = piVar10[iVar26];
          pPVar9 = pPVar24[iVar26].next;
          pPVar11 = pPVar24[iVar26].prev;
          pPVar9->prev = pPVar11;
          pPVar11->next = pPVar9;
          pPVar9 = pPVar22[iVar25].next;
          pPVar24[iVar26].next = pPVar9;
          pPVar9->prev = pPVar24 + iVar26;
          pPVar24[iVar26].prev = pPVar22 + iVar25;
          pPVar22[iVar25].next = pPVar24 + iVar26;
          iVar26 = piVar32[lVar28 + -1];
          lVar28 = lVar28 + -1;
        } while (iVar26 != iVar3);
        iVar25 = (int)lVar28;
      }
      iVar26 = (this->temp).stage;
      (this->temp).stage = iVar26 + 1;
      pnVar12 = (this->u).row.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_88.m_backend.data._M_elems._0_8_ =
           *(undefined8 *)pnVar12[lVar28].m_backend.data._M_elems;
      local_88.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((long)pnVar12[lVar28].m_backend.data._M_elems + 8);
      puVar1 = (uint *)((long)pnVar12[lVar28].m_backend.data._M_elems + 0x10);
      local_88.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_88.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)pnVar12[lVar28].m_backend.data._M_elems + 0x20);
      local_88.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_88.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)pnVar12[lVar28].m_backend.data._M_elems + 0x30);
      local_88.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_88.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      local_88.m_backend.exp = pnVar12[lVar28].m_backend.exp;
      local_88.m_backend.neg = pnVar12[lVar28].m_backend.neg;
      local_88.m_backend.fpclass = pnVar12[lVar28].m_backend.fpclass;
      local_88.m_backend.prec_elem = pnVar12[lVar28].m_backend.prec_elem;
      setPivot(this,iVar26,iVar3,iVar4,&local_88);
      piVar32 = (this->u).row.idx;
      piVar32[lVar28] = piVar32[lVar30];
      pnVar12 = (this->u).row.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar14 = *(undefined8 *)pnVar12[lVar30].m_backend.data._M_elems;
      uVar15 = *(undefined8 *)((long)pnVar12[lVar30].m_backend.data._M_elems + 8);
      puVar1 = (uint *)((long)pnVar12[lVar30].m_backend.data._M_elems + 0x10);
      uVar16 = *(undefined8 *)puVar1;
      uVar17 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)pnVar12[lVar30].m_backend.data._M_elems + 0x20);
      uVar18 = *(undefined8 *)puVar1;
      uVar19 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)pnVar12[lVar30].m_backend.data._M_elems + 0x30);
      uVar20 = *(undefined8 *)(puVar1 + 2);
      puVar2 = (uint *)((long)pnVar12[lVar28].m_backend.data._M_elems + 0x30);
      *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
      *(undefined8 *)(puVar2 + 2) = uVar20;
      puVar1 = (uint *)((long)pnVar12[lVar28].m_backend.data._M_elems + 0x20);
      *(undefined8 *)puVar1 = uVar18;
      *(undefined8 *)(puVar1 + 2) = uVar19;
      puVar1 = (uint *)((long)pnVar12[lVar28].m_backend.data._M_elems + 0x10);
      *(undefined8 *)puVar1 = uVar16;
      *(undefined8 *)(puVar1 + 2) = uVar17;
      *(undefined8 *)pnVar12[lVar28].m_backend.data._M_elems = uVar14;
      *(undefined8 *)((long)pnVar12[lVar28].m_backend.data._M_elems + 8) = uVar15;
      pnVar12[lVar28].m_backend.exp = pnVar12[lVar30].m_backend.exp;
      pnVar12[lVar28].m_backend.neg = pnVar12[lVar30].m_backend.neg;
      iVar21 = pnVar12[lVar30].m_backend.prec_elem;
      pnVar12[lVar28].m_backend.fpclass = pnVar12[lVar30].m_backend.fpclass;
      pnVar12[lVar28].m_backend.prec_elem = iVar21;
      piVar32 = (this->u).row.start;
      pPVar22 = (this->temp).pivot_colNZ;
      iVar3 = piVar32[iVar4];
      if (iVar3 < iVar25) {
        piVar6 = (this->u).row.idx;
        piVar7 = (this->u).col.idx;
        piVar8 = (this->u).col.len;
        piVar10 = (this->u).col.start;
        piVar13 = (this->temp).s_cact;
        pPVar24 = (this->temp).pivot_col;
        lVar30 = (long)iVar25;
        do {
          iVar26 = piVar6[lVar30 + -1];
          lVar30 = lVar30 + -1;
          iVar25 = piVar10[iVar26];
          iVar5 = piVar8[iVar26];
          iVar31 = piVar13[iVar26];
          piVar13[iVar26] = iVar31 + -1;
          iVar31 = (iVar25 + iVar5) - iVar31;
          piVar27 = piVar7 + iVar31;
          do {
            piVar29 = piVar27;
            piVar27 = piVar29 + 1;
          } while (*piVar29 != iVar4);
          *piVar29 = piVar7[iVar31];
          piVar7[iVar31] = iVar4;
          iVar25 = piVar13[iVar26];
          pPVar9 = pPVar24[iVar26].next;
          pPVar11 = pPVar24[iVar26].prev;
          pPVar9->prev = pPVar11;
          pPVar11->next = pPVar9;
          pPVar9 = pPVar22[iVar25].next;
          pPVar24[iVar26].next = pPVar9;
          pPVar9->prev = pPVar24 + iVar26;
          pPVar24[iVar26].prev = pPVar22 + iVar25;
          pPVar22[iVar25].next = pPVar24 + iVar26;
        } while (iVar3 < lVar30);
      }
      pPVar23 = pPVar23->prev;
      pPVar24 = pPVar22 + 1;
    } while (pPVar23 != pPVar24);
  }
  pPVar22[1].next = pPVar22 + 1;
  pPVar22[1].prev = pPVar24;
  return;
}

Assistant:

void CLUFactor<R>::eliminateColSingletons()
{
   int i, j, k, m, c;
   int pcol, prow;
   CLUFactor<R>::Pring* sing;

   for(sing = temp.pivot_colNZ[1].prev;
         sing != &(temp.pivot_colNZ[1]);
         sing = sing->prev)
   {
      /*      Find pivot value
       */
      pcol = sing->idx;
      j = --(u.col.len[pcol]) + u.col.start[pcol];   /* remove pivot column */
      prow = u.col.idx[j];
      removeDR(temp.pivot_row[prow]);

      j = --(u.row.len[prow]) + u.row.start[prow];

      for(i = j; (c = u.row.idx[i]) != pcol; --i)
      {
         m = u.col.len[c] + u.col.start[c] - (temp.s_cact[c])--;

         for(k = m; u.col.idx[k] != prow; ++k)
            ;

         u.col.idx[k] = u.col.idx[m];

         u.col.idx[m] = prow;

         m = temp.s_cact[c];

         removeDR(temp.pivot_col[c]);

         init2DR(temp.pivot_col[c], temp.pivot_colNZ[m]);

         assert(col.perm[c] < 0);
      }

      /*      remove pivot element from pivot row
       */
      setPivot(temp.stage++, pcol, prow, u.row.val[i]);

      u.row.idx[i] = u.row.idx[j];

      u.row.val[i] = u.row.val[j];

      j = u.row.start[prow];

      for(--i; i >= j; --i)
      {
         c = u.row.idx[i];
         m = u.col.len[c] + u.col.start[c] - (temp.s_cact[c])--;

         for(k = m; u.col.idx[k] != prow; ++k)
            ;

         u.col.idx[k] = u.col.idx[m];

         u.col.idx[m] = prow;

         m = temp.s_cact[c];

         removeDR(temp.pivot_col[c]);

         init2DR(temp.pivot_col[c], temp.pivot_colNZ[m]);

         assert(col.perm[c] < 0);
      }
   }

   initDR(temp.pivot_colNZ[1]);    /* Remove all column singletons from list */
}